

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::rewireIfaceArrayIndices
          (PortConnectionBuilder *this,Symbol *sym,string_view name,SourceLocation loc,
          span<const_slang::ConstantRange,_18446744073709551615UL> portDims)

{
  pointer pCVar1;
  SyntaxNode *pSVar2;
  span<const_slang::ConstantRange,_18446744073709551615UL> portDims_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> portDims_01;
  int iVar3;
  undefined4 extraout_var;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  __extent_storage<18446744073709551615UL> _Var4;
  long lVar5;
  Compilation *args;
  long lVar6;
  SmallVector<const_slang::ast::Symbol_*,_5UL> newElems;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_c0;
  pointer local_b0;
  SourceLocation local_a8;
  pointer local_a0;
  size_t sStack_98;
  pointer local_90;
  size_t sStack_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  SmallVectorBase<const_slang::ast::Symbol_*> local_70 [2];
  
  local_80._M_str = name._M_str;
  local_80._M_len = name._M_len;
  if (sym == (Symbol *)0x0) {
    sym = (Symbol *)0x0;
  }
  else if (sym->kind == InstanceArray) {
    _Var4._M_extent_value = portDims._M_extent._M_extent_value - 1;
    pCVar1 = portDims._M_ptr + 1;
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    local_b0 = portDims._M_ptr;
    pSVar2 = sym[1].originatingSyntax;
    lVar5 = *(long *)(sym + 2) << 3;
    local_a8 = loc;
    if (*(int *)((long)&sym[2].name._M_len + 4) <= (int)sym[2].name._M_len ==
        (portDims._M_ptr)->right <= (portDims._M_ptr)->left) {
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 8) {
        portDims_01._M_extent._M_extent_value = _Var4._M_extent_value;
        portDims_01._M_ptr = pCVar1;
        local_a0 = pCVar1;
        sStack_98 = _Var4._M_extent_value;
        local_c0._M_ptr =
             (pointer)rewireIfaceArrayIndices
                                (this,*(Symbol **)((long)&pSVar2->kind + lVar6),name,loc,portDims_01
                                );
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_70,(Symbol **)&local_c0);
        portDims._M_ptr = extraout_RDX_00;
      }
    }
    else {
      for (; lVar5 != 0; lVar5 = lVar5 + -8) {
        portDims_00._M_extent._M_extent_value = _Var4._M_extent_value;
        portDims_00._M_ptr = pCVar1;
        local_90 = pCVar1;
        sStack_88 = _Var4._M_extent_value;
        local_c0._M_ptr =
             (pointer)rewireIfaceArrayIndices
                                (this,*(Symbol **)((long)pSVar2 + lVar5 + -8),name,loc,portDims_00);
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_70,(Symbol **)&local_c0);
        portDims._M_ptr = extraout_RDX;
      }
    }
    args = this->comp;
    iVar3 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                      (local_70,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)portDims._M_ptr);
    local_c0._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
    sym = &BumpAllocator::
           emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange_const&>
                     (&args->super_BumpAllocator,args,&local_80,&local_a8,&local_c0,local_b0)->
           super_Symbol;
    SmallVectorBase<const_slang::ast::Symbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)args);
  }
  return &((InstanceArraySymbol *)sym)->super_Symbol;
}

Assistant:

const Symbol* rewireIfaceArrayIndices(const Symbol* sym, std::string_view name,
                                          SourceLocation loc,
                                          std::span<const ConstantRange> portDims) {
        if (!sym || sym->kind != SymbolKind::InstanceArray)
            return sym;

        // The port dimensions are guaranteed to have the same count and width as
        // the instance array dimensions but their indices may differ, so this
        // function creates a new array with the correct range.
        SLANG_ASSERT(!portDims.empty());
        auto subPortDims = portDims.subspan(1);

        SmallVector<const Symbol*> newElems;
        auto& arr = sym->as<InstanceArraySymbol>();
        if (arr.range.isLittleEndian() != portDims[0].isLittleEndian()) {
            for (auto elem : std::views::reverse(arr.elements))
                newElems.push_back(rewireIfaceArrayIndices(elem, name, loc, subPortDims));
        }
        else {
            for (auto elem : arr.elements)
                newElems.push_back(rewireIfaceArrayIndices(elem, name, loc, subPortDims));
        }

        return comp.emplace<InstanceArraySymbol>(comp, name, loc, newElems.copy(comp), portDims[0]);
    }